

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_60f7b::GeneratedCode_RepeatedMessage_Test::~GeneratedCode_RepeatedMessage_Test
          (GeneratedCode_RepeatedMessage_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GeneratedCode, RepeatedMessage) {
  upb_Arena* arena = upb_Arena_New();
  protobuf_test_messages_proto2_TestAllTypesProto2* msg =
      protobuf_test_messages_proto2_TestAllTypesProto2_new(arena);

  const upb_MiniTableField* repeated_nested_message_field =
      find_proto2_field(kFieldOptionalRepeatedNestedMessage);
  upb_Message* msg1 = (upb_Message*)
      protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_new(arena);
  upb_Message* msg2 = (upb_Message*)
      protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage_new(arena);

  upb_Array* array = upb_Message_GetOrCreateMutableArray(
      UPB_UPCAST(msg), repeated_nested_message_field, arena);
  upb_MessageValue val1;
  val1.msg_val = msg1;
  upb_MessageValue val2;
  val2.msg_val = msg2;
  EXPECT_TRUE(upb_Array_Append(array, val1, arena));
  EXPECT_TRUE(upb_Array_Append(array, val2, arena));

  EXPECT_EQ(msg1, upb_Array_GetMutable(array, 0));
  EXPECT_EQ(msg1, upb_Array_Get(array, 0).msg_val);
  EXPECT_EQ(msg2, upb_Array_GetMutable(array, 1));
  EXPECT_EQ(msg2, upb_Array_Get(array, 1).msg_val);

  upb_Arena_Free(arena);
}